

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dmemory.c
# Opt level: O2

int dLUWorkInit(int m,int n,int panel_size,int **iworkptr,double **dworkptr,GlobalLU_t *Glu)

{
  int_t *piVar1;
  int iVar2;
  int iVar3;
  int *piVar4;
  double *pdVar5;
  double *pdVar6;
  int bytes;
  
  iVar2 = sp_ienv(3);
  iVar3 = sp_ienv(7);
  iVar2 = sp_ienv((uint)(iVar2 <= iVar3) * 4 + 3);
  iVar3 = sp_ienv(4);
  bytes = (panel_size * 2 + 5) * m * 4;
  iVar2 = (iVar3 + iVar2) * panel_size;
  if (iVar2 <= m) {
    iVar2 = m;
  }
  if (Glu->MemModel == SYSTEM) {
    piVar4 = int32Calloc(bytes >> 2);
  }
  else {
    piVar4 = (int *)duser_malloc(bytes,1,Glu);
  }
  *iworkptr = piVar4;
  if (piVar4 == (int *)0x0) {
    fwrite("dLUWorkInit: malloc fails for local iworkptr[]\n",0x2f,1,_stderr);
    iVar2 = bytes + n;
  }
  else {
    iVar3 = (iVar2 + panel_size * m) * 8;
    if (Glu->MemModel == SYSTEM) {
      pdVar5 = (double *)superlu_malloc((long)iVar3);
      *dworkptr = pdVar5;
    }
    else {
      pdVar5 = (double *)duser_malloc(iVar3,1,Glu);
      *dworkptr = pdVar5;
      if (((ulong)pdVar5 & 7) != 0) {
        pdVar6 = (double *)(((long)pdVar5 + 7U & 0xfffffffffffffff8) - 8);
        *dworkptr = pdVar6;
        iVar2 = (int)pdVar5 - (int)pdVar6;
        piVar1 = &(Glu->stack).top2;
        *piVar1 = *piVar1 - iVar2;
        piVar1 = &(Glu->stack).used;
        *piVar1 = *piVar1 + iVar2;
        return 0;
      }
    }
    iVar2 = 0;
    if (pdVar5 == (double *)0x0) {
      fwrite("malloc fails for local dworkptr[].",0x22,1,_stderr);
      iVar2 = bytes + n + iVar3;
    }
  }
  return iVar2;
}

Assistant:

int
dLUWorkInit(int m, int n, int panel_size, int **iworkptr, 
            double **dworkptr, GlobalLU_t *Glu)
{
    int    isize, dsize, extra;
    double *old_ptr;
    int    maxsuper = SUPERLU_MAX( sp_ienv(3), sp_ienv(7) ),
           rowblk   = sp_ienv(4);

    /* xplore[m] and xprune[n] can be 64-bit; they are allocated separately */
    //isize = ( (2 * panel_size + 3 + NO_MARKER ) * m + n ) * sizeof(int);
    isize = ( (2 * panel_size + 2 + NO_MARKER ) * m ) * sizeof(int);
    dsize = (m * panel_size +
	     NUM_TEMPV(m,panel_size,maxsuper,rowblk)) * sizeof(double);
    
    if ( Glu->MemModel == SYSTEM ) 
	*iworkptr = (int *) int32Calloc(isize/sizeof(int));
    else
	*iworkptr = (int *) duser_malloc(isize, TAIL, Glu);
    if ( ! *iworkptr ) {
	fprintf(stderr, "dLUWorkInit: malloc fails for local iworkptr[]\n");
	return (isize + n);
    }

    if ( Glu->MemModel == SYSTEM )
	*dworkptr = (double *) SUPERLU_MALLOC(dsize);
    else {
	*dworkptr = (double *) duser_malloc(dsize, TAIL, Glu);
	if ( NotDoubleAlign(*dworkptr) ) {
	    old_ptr = *dworkptr;
	    *dworkptr = (double*) DoubleAlign(*dworkptr);
	    *dworkptr = (double*) ((double*)*dworkptr - 1);
	    extra = (char*)old_ptr - (char*)*dworkptr;
#if ( DEBUGlevel>=1 )
	    printf("dLUWorkInit: not aligned, extra %d\n", extra); fflush(stdout);
#endif	    
	    Glu->stack.top2 -= extra;
	    Glu->stack.used += extra;
	}
    }
    if ( ! *dworkptr ) {
	fprintf(stderr, "malloc fails for local dworkptr[].");
	return (isize + dsize + n);
    }
	
    return 0;
}